

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islist.h
# Opt level: O1

void __thiscall
soplex::IsList<soplex::SVSetBase<double>::DLPSV>::clear
          (IsList<soplex::SVSetBase<double>::DLPSV> *this,bool pDestroyElements)

{
  DLPSV *__ptr;
  undefined3 in_register_00000031;
  DLPSV *pDVar1;
  
  if (CONCAT31(in_register_00000031,pDestroyElements) != 0) {
    __ptr = this->the_first;
    while (__ptr != (DLPSV *)0x0) {
      if (this->the_last == __ptr) {
        pDVar1 = (DLPSV *)0x0;
      }
      else {
        pDVar1 = __ptr->thenext;
      }
      free(__ptr);
      __ptr = pDVar1;
    }
  }
  this->the_first = (DLPSV *)0x0;
  this->the_last = (DLPSV *)0x0;
  return;
}

Assistant:

void clear(bool pDestroyElements = false)
   {
      if(pDestroyElements)
      {
         T* nextElement;

         for(T* it = the_first; it; it = nextElement)
         {
            nextElement = next(it);
            it->~T();
            spx_free(it);
         }
      }

      the_first = the_last = nullptr;
   }